

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArray<char,_false,_true>::DirectSetItemNoSet
          (TypedArray<char,_false,_true> *this,uint32 index,Var value)

{
  BOOL BVar1;
  Var value_local;
  uint32 index_local;
  TypedArray<char,_false,_true> *this_local;
  
  BVar1 = BaseTypedDirectSetItemNoSet(this,index,value,JavascriptConversion::ToInt8);
  return BVar1;
}

Assistant:

inline BOOL Int8VirtualArray::DirectSetItemNoSet(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItemNoSet(index, value, JavascriptConversion::ToInt8);
    }